

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_buffer.cc
# Opt level: O2

size_t __thiscall raptor::SliceBuffer::CopyToBuffer(SliceBuffer *this,void *buffer,size_t length)

{
  size_t sVar1;
  ulong __n;
  uint8_t *__src;
  size_t sVar2;
  pointer this_00;
  
  if (length <= this->_length) {
    this_00 = (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar2 = 0;
    for (; (this_00 !=
            (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
            super__Vector_impl_data._M_finish && (length != 0)); length = length - __n) {
      sVar1 = Slice::size(this_00);
      __n = length;
      if (sVar1 <= length) {
        __n = Slice::size(this_00);
      }
      __src = Slice::begin(this_00);
      memcpy((void *)((long)buffer + sVar2),__src,__n);
      sVar2 = sVar2 + __n;
      this_00 = this_00 + 1;
    }
    return sVar2;
  }
  LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/slice/slice_buffer.cc"
                 ,0x6a,kLogLevelError,"assertion failed: %s","length <= GetBufferLength()");
  abort();
}

Assistant:

size_t SliceBuffer::CopyToBuffer(void* buffer, size_t length) {
    RAPTOR_ASSERT(length <= GetBufferLength());

    auto it = _vs.begin();

    size_t left = length;
    size_t pos = 0;

    while(it != _vs.end() && left != 0) {

        size_t len = RAPTOR_MIN(left, it->size());
        memcpy((uint8_t*)buffer + pos, it->begin(), len);

        left -= len;
        pos += len;

        ++it;
    }

    return pos;
}